

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O0

void __thiscall
TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
          (TPZStepSolver<std::complex<long_double>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *refmat)

{
  TPZStepSolver<std::complex<long_double>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *in_stack_ffffffffffffffa8;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *Refmat;
  void **vtt;
  TPZStepSolver<std::complex<long_double>_> *this_00;
  
  vtt = (void **)0x0;
  Refmat = (TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)0x21;
  this_00 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZStepSolver<std::complex<long_double>>>(in_RDI,0x21);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)in_RSI,
             in_stack_ffffffffffffffa8);
  TPZMatrixSolver<std::complex<long_double>_>::TPZMatrixSolver
            (&this_00->super_TPZMatrixSolver<std::complex<long_double>_>,vtt,Refmat);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZStepSolver_023e2ad0;
  *(undefined8 *)(in_RDI + 0xb8) = 0xffffffffffffffff;
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)0x1187bc6);
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  ResetSolver(in_RSI);
  return;
}

Assistant:

TPZStepSolver<TVar>::TPZStepSolver(TPZAutoPointer<TPZMatrix<TVar> > refmat) : TPZRegisterClassId(&TPZStepSolver::ClassId),TPZMatrixSolver<TVar>(refmat), fNumIterations(-1) {
	fPrecond = 0;
	ResetSolver();
}